

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QSharedPointer<int>>
          (PromiseError *this,QSharedPointer<int> *value)

{
  Data *pDVar1;
  void *__tmp;
  undefined8 *puVar2;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = value->value;
  pDVar1 = value->d;
  puVar2[1] = pDVar1;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    *(int *)(puVar2[1] + 4) = *(int *)(puVar2[1] + 4) + 1;
    UNLOCK();
  }
  __cxa_throw(puVar2,&QSharedPointer<int>::typeinfo,QSharedPointer<int>::~QSharedPointer);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }